

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckImage(TidyDocImpl *doc,Node *node)

{
  tmbchar *s1;
  long lVar1;
  uint uVar2;
  Attribute *pAVar3;
  Node *pNVar4;
  Node *pNVar5;
  Lexer *pLVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  Bool BVar15;
  int iVar16;
  char *pcVar17;
  ctmbstr ptVar18;
  ulong uVar19;
  ctmbstr cp;
  AttVal *pAVar20;
  
  if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) {
    return;
  }
  pAVar20 = node->attributes;
  bVar11 = false;
  if (pAVar20 == (AttVal *)0x0) {
    bVar9 = true;
    bVar13 = false;
    bVar8 = 0;
    bVar7 = false;
    bVar12 = false;
  }
  else {
    bVar9 = false;
    bVar12 = false;
    bVar7 = false;
    bVar10 = false;
    bVar8 = 0;
    bVar13 = false;
    do {
      pAVar3 = pAVar20->dict;
      if (pAVar3 != (Attribute *)0x0) {
        if (pAVar3->id == TidyAttr_ALT) {
          if (pAVar20->value != (ctmbstr)0x0) {
            uVar14 = prvTidytmbstrlen(pAVar20->value);
            if (uVar14 < 0x96) {
              ptVar18 = pAVar20->value;
              BVar15 = IsPlaceholderAlt(ptVar18);
              if ((((BVar15 != no) || (pcVar17 = strstr(ptVar18,"object"), pcVar17 != (char *)0x0))
                  || (BVar15 = EndsWithBytes(ptVar18), BVar15 != no)) ||
                 (BVar15 = IsImage(pAVar20->value), BVar15 != no)) goto LAB_0013a23d;
            }
            else {
LAB_0013a23d:
              uVar14 = prvTidytmbstrlen(pAVar20->value);
              if (uVar14 < 0x97) {
                BVar15 = IsImage(pAVar20->value);
                if (BVar15 == no) {
                  ptVar18 = pAVar20->value;
                  BVar15 = IsPlaceholderAlt(ptVar18);
                  if (BVar15 == no) {
                    BVar15 = EndsWithBytes(ptVar18);
                    if (BVar15 == no) goto LAB_0013a3b6;
                    uVar14 = 0x296;
                  }
                  else {
                    uVar14 = 0x297;
                  }
                }
                else {
                  uVar14 = 0x295;
                }
              }
              else {
                uVar14 = 0x298;
              }
              prvTidyReportAccessError(doc,node,uVar14);
            }
            bVar9 = true;
          }
        }
        else if (pAVar3 != (Attribute *)0x0) {
          if (pAVar3->id == TidyAttr_WIDTH) {
            pcVar17 = pAVar20->value;
            if (pcVar17 != (char *)0x0) {
              do {
                if (*pcVar17 == '\0') goto LAB_0013a3b6;
                BVar15 = prvTidyIsWhite((int)*pcVar17);
                pcVar17 = pcVar17 + 1;
              } while (BVar15 != no);
              iVar16 = atoi(pAVar20->value);
              if (iVar16 < 0x1e) {
                bVar10 = true;
              }
              if (0x96 < iVar16) {
                bVar7 = true;
              }
            }
          }
          else if (pAVar3 != (Attribute *)0x0) {
            if (pAVar3->id == TidyAttr_HEIGHT) {
              pcVar17 = pAVar20->value;
              if (pcVar17 != (char *)0x0) {
                do {
                  if (*pcVar17 == '\0') goto LAB_0013a3b6;
                  BVar15 = prvTidyIsWhite((int)*pcVar17);
                  pcVar17 = pcVar17 + 1;
                } while (BVar15 != no);
                iVar16 = atoi(pAVar20->value);
                if (iVar16 < 0x1e) {
                  bVar8 = 1;
                }
              }
            }
            else if (pAVar3 != (Attribute *)0x0) {
              if (pAVar3->id == TidyAttr_LONGDESC) {
                pcVar17 = pAVar20->value;
                if (pcVar17 != (char *)0x0) {
                  do {
                    if (*pcVar17 == '\0') goto LAB_0013a3b6;
                    BVar15 = prvTidyIsWhite((int)*pcVar17);
                    pcVar17 = pcVar17 + 1;
                  } while (BVar15 != no);
                  uVar14 = prvTidytmbstrlen(pAVar20->value);
                  if (1 < uVar14) {
                    bVar13 = true;
                  }
                }
              }
              else if (pAVar3 != (Attribute *)0x0) {
                if (pAVar3->id == TidyAttr_USEMAP) {
                  pcVar17 = pAVar20->value;
                  if (pcVar17 != (char *)0x0) {
                    do {
                      if (*pcVar17 == '\0') goto LAB_0013a3b6;
                      BVar15 = prvTidyIsWhite((int)*pcVar17);
                      pcVar17 = pcVar17 + 1;
                    } while (BVar15 != no);
                    (doc->access).HasUseMap = yes;
                  }
                }
                else if ((pAVar3 != (Attribute *)0x0) && (pAVar3->id == TidyAttr_ISMAP)) {
                  bVar12 = true;
                }
              }
            }
          }
        }
      }
LAB_0013a3b6:
      pAVar20 = pAVar20->next;
    } while (pAVar20 != (AttVal *)0x0);
    bVar9 = !bVar9;
    bVar7 = bVar7 || bVar10;
  }
  pNVar4 = node->next;
  if (((pNVar4 != (Node *)0x0) && (pNVar4->tag != (Dict *)0x0)) &&
     ((pNVar4->tag->id == TidyTag_A &&
      ((pNVar5 = pNVar4->content, node = pNVar4, pNVar5 != (Node *)0x0 &&
       (pNVar5->tag == (Dict *)0x0)))))) {
    s1 = (doc->access).text;
    uVar2 = pNVar5->start;
    if (uVar2 < pNVar5->end) {
      pLVar6 = doc->lexer;
      uVar19 = 0;
      do {
        s1[uVar19] = pLVar6->lexbuf[uVar19 + uVar2];
        if (uVar19 == 0x7f) {
          uVar19 = 0x7f;
          break;
        }
        lVar1 = uVar2 + uVar19;
        uVar19 = uVar19 + 1;
      } while (lVar1 + 1U < (ulong)pNVar5->end);
      uVar19 = uVar19 & 0xffffffff;
    }
    else {
      uVar19 = 0;
    }
    s1[uVar19] = '\0';
    iVar16 = prvTidytmbstrcmp(s1,"d");
    if (iVar16 != 0) {
      iVar16 = prvTidytmbstrcmp(s1,"D");
      bVar11 = false;
      if (iVar16 != 0) goto LAB_0013a4cb;
    }
    bVar11 = true;
  }
LAB_0013a4cb:
  pNVar4 = node->next;
  if (((((pNVar4 != (Node *)0x0) && (pNVar4->tag == (Dict *)0x0)) &&
       (pNVar5 = pNVar4->next, node = pNVar4, pNVar5 != (Node *)0x0)) &&
      ((pNVar5->tag != (Dict *)0x0 && (pNVar5->tag->id == TidyTag_A)))) &&
     ((pNVar4 = pNVar5->content, node = pNVar5, pNVar4 != (Node *)0x0 &&
      (pNVar4->tag == (Dict *)0x0)))) {
    ptVar18 = textFromOneNode(doc,pNVar4);
    iVar16 = prvTidytmbstrcmp(ptVar18,"d");
    if ((iVar16 == 0) || (iVar16 = prvTidytmbstrcmp(ptVar18,"D"), iVar16 == 0)) {
      bVar11 = true;
    }
  }
  if (bVar9) {
    prvTidyReportAccessError(doc,node,0x294);
  }
  if (!(bool)(!bVar13 & bVar8 & bVar7)) {
    if (bVar11 && !bVar13) {
      prvTidyReportAccessError(doc,node,0x29b);
    }
    if (bVar13 && !bVar11) {
      prvTidyReportAccessError(doc,node,0x29a);
    }
    if (!bVar11 && !bVar13) {
      prvTidyReportAccessError(doc,node,0x299);
    }
  }
  if (!bVar12) {
    return;
  }
  prvTidyReportAccessError(doc,node,0x2eb);
  prvTidyReportAccessError(doc,node,0x2a9);
  return;
}

Assistant:

static void CheckImage( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool HasIsMap = no;
    Bool HasLongDesc = no;
    Bool HasDLINK = no;
    Bool HasValidHeight = no;
    Bool HasValidWidthBullet = no;
    Bool HasValidWidthHR = no; 
    Bool HasTriggeredMissingLongDesc = no;

    AttVal* av;
                
    if (Level1_Enabled( doc ))
    {
        /* Checks all image attributes for invalid values within attributes */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* 
               Checks for valid ALT attribute.
               The length of the alt text must be less than 150 characters 
               long.
            */
            if ( attrIsALT(av) )
            {
                if (av->value != NULL) 
                {
                    if ((TY_(tmbstrlen)(av->value) < 150) &&
                        (IsPlaceholderAlt (av->value) == no) &&
                        (IsPlaceHolderObject (av->value) == no) &&
                        (EndsWithBytes (av->value) == no) &&
                        (IsImage (av->value) == no))
                    {
                        HasAlt = yes;
                    }

                    else if (TY_(tmbstrlen)(av->value) > 150)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_TOO_LONG );
                    }

                    else if (IsImage (av->value) == yes)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_FILENAME);
                    }
            
                    else if (IsPlaceholderAlt (av->value) == yes)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_PLACEHOLDER);
                    }

                    else if (EndsWithBytes (av->value) == yes)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_FILE_SIZE);
                    }
                }
            }

            /* 
               Checks for width values of 'bullets' and 'horizontal
               rules' for validity.

               Valid pixel width for 'bullets' must be < 30, and > 150 for
               horizontal rules.
            */
            else if ( attrIsWIDTH(av) )
            {
                /* Longdesc attribute needed if width attribute is not present. */
                if ( hasValue(av) )
                {
                    int width = atoi( av->value );
                    if ( width < 30 )
                        HasValidWidthBullet = yes;

                    if ( width > 150 )
                        HasValidWidthHR = yes;
                }
            }

            /* 
               Checks for height values of 'bullets' and horizontal
               rules for validity.

               Valid pixel height for 'bullets' and horizontal rules 
               mustt be < 30.
            */
            else if ( attrIsHEIGHT(av) )
            {
                /* Longdesc attribute needed if height attribute not present. */
                if ( hasValue(av) && atoi(av->value) < 30 )
                    HasValidHeight = yes;
            }

            /* 
               Checks for longdesc and determines validity.  
               The length of the 'longdesc' must be > 1
            */
            else if ( attrIsLONGDESC(av) )
            {
                if ( hasValue(av) && TY_(tmbstrlen)(av->value) > 1 )
                    HasLongDesc = yes;
              }

            /* 
               Checks for 'USEMAP' attribute.  Ensures that
               text links are provided for client-side image maps
            */
            else if ( attrIsUSEMAP(av) )
            {
                if ( hasValue(av) )
                    doc->access.HasUseMap = yes;
            }    

            else if ( attrIsISMAP(av) )
            {
                HasIsMap = yes;
            }
        }    
        
        
        /* 
            Check to see if a dLINK is present.  The ANCHOR element must
            be present following the IMG element.  The text found between 
            the ANCHOR tags must be < 6 characters long, and must contain
            the letter 'd'.
        */
        if ( nodeIsA(node->next) )
        {
            node = node->next;
            
            /* 
                Node following the anchor must be a text node
                for dLINK to exist 
            */

            if (node->content != NULL && (node->content)->tag == NULL)
            {
                /* Number of characters found within the text node */
                ctmbstr word = textFromOneNode( doc, node->content);
                    
                if ((TY_(tmbstrcmp)(word,"d") == 0)||
                    (TY_(tmbstrcmp)(word,"D") == 0))
                {
                    HasDLINK = yes;
                }
            }
        }
                    
        /*
            Special case check for dLINK.  This will occur if there is 
            whitespace between the <img> and <a> elements.  Ignores 
            whitespace and continues check for dLINK.
        */
        
        if ( node->next && !node->next->tag )
        {
            node = node->next;

            if ( nodeIsA(node->next) )
            {
                node = node->next;

                /* 
                    Node following the ANCHOR must be a text node
                    for dLINK to exist 
                */
                if (node->content != NULL && node->content->tag == NULL)
                {
                    /* Number of characters found within the text node */
                    ctmbstr word = textFromOneNode( doc, node->content );

                    if ((TY_(tmbstrcmp)(word, "d") == 0)||
                        (TY_(tmbstrcmp)(word, "D") == 0))
                    {
                        HasDLINK = yes;
                    }
                }
            }
        }

        if ((HasAlt == no)&&
            (HasValidWidthBullet == yes)&&
            (HasValidHeight == yes))
        {
        }

        if ((HasAlt == no)&&
            (HasValidWidthHR == yes)&&
            (HasValidHeight == yes))
        {
        }

        if (HasAlt == no)
        {
            TY_(ReportAccessError)( doc, node, IMG_MISSING_ALT);
        }

        if ((HasLongDesc == no)&&
            (HasValidHeight ==yes)&&
            ((HasValidWidthHR == yes)||
             (HasValidWidthBullet == yes)))
        {
            HasTriggeredMissingLongDesc = yes;
        }

        if (HasTriggeredMissingLongDesc == no)
        {
            if ((HasDLINK == yes)&&
                (HasLongDesc == no))
            {
                TY_(ReportAccessError)( doc, node, IMG_MISSING_LONGDESC);
            }

            if ((HasLongDesc == yes)&&
                (HasDLINK == no))
            {
                TY_(ReportAccessError)( doc, node, IMG_MISSING_DLINK);
            }

            if ((HasLongDesc == no)&&
                (HasDLINK == no))
            {
                TY_(ReportAccessError)( doc, node, IMG_MISSING_LONGDESC_DLINK);
            }
        }

        if (HasIsMap == yes)
        {
            TY_(ReportAccessError)( doc, node, IMAGE_MAP_SERVER_SIDE_REQUIRES_CONVERSION);

            TY_(ReportAccessError)( doc, node, IMG_MAP_SERVER_REQUIRES_TEXT_LINKS);
        }
    }
}